

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O2

bool __thiscall
optimization::global_expr_move::BlockOps::has_op
          (BlockOps *this,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  bool bVar1;
  variant_alternative_t<1UL,_variant<Op,_pair<pair<VarId,_Value>,_VarId>_>_> *pvVar2;
  _Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
  _Var3;
  variant_alternative_t<0UL,_variant<Op,_pair<pair<VarId,_Value>,_VarId>_>_> *__k;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> load;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> pStack_a8;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_68;
  
  std::__detail::__variant::
  _Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     *)&local_68,
                    (_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     *)op);
  bVar1 = disable_op(this,&local_68);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    if ((op->
        super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        ).
        super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        ._M_index == '\0') {
      __k = std::
            get<0ul,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                      (op);
      _Var3._M_cur = (__node_type *)
                     std::
                     _Hashtable<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)this,__k);
    }
    else {
      pvVar2 = std::
               get<1ul,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                         (op);
      std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>::pair
                (&pStack_a8,pvVar2);
      _Var3._M_cur = (__node_type *)
                     std::
                     map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
                     ::count(&this->loads,&pStack_a8.first);
    }
    bVar1 = _Var3._M_cur != (__node_type *)0x0;
  }
  return bVar1;
}

Assistant:

bool has_op(std::variant<Op, LoadOp> op) {
    // for (auto& op : ops) {
    //   auto opInst =
    //       mir::inst::OpInst(mir::inst::VarId(0), op.lhs, op.rhs, op.op);
    //   std::cout << opInst << std::endl;
    // }
    if (disable_op(op)) {
      return false;
    }
    if (op.index() == 0) {
      return ops.find(std::get<Op>(op)) != ops.end();
    } else {
      auto load = std::get<LoadOp>(op);
      return loads.count(load.first);
    }
  }